

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglImageFormatTests.cpp
# Opt level: O0

void __thiscall
deqp::egl::Image::ImageTests::addCreateTextureCubemapActions
          (ImageTests *this,string *suffix,GLenum internalFormat,GLenum format,GLenum type)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  GLenum local_24;
  GLenum local_20;
  GLenum type_local;
  GLenum format_local;
  GLenum internalFormat_local;
  string *suffix_local;
  ImageTests *this_local;
  
  local_24 = type;
  local_20 = format;
  type_local = internalFormat;
  _format_local = suffix;
  suffix_local = (string *)this;
  std::operator+(&local_48,"cubemap_positive_x",suffix);
  addCreateTexture(this,&local_48,0x30b3,type_local,local_20,local_24);
  std::__cxx11::string::~string((string *)&local_48);
  std::operator+(&local_78,"cubemap_positive_y",_format_local);
  addCreateTexture(this,&local_78,0x30b5,type_local,local_20,local_24);
  std::__cxx11::string::~string((string *)&local_78);
  std::operator+(&local_98,"cubemap_positive_z",_format_local);
  addCreateTexture(this,&local_98,0x30b7,type_local,local_20,local_24);
  std::__cxx11::string::~string((string *)&local_98);
  std::operator+(&local_b8,"cubemap_negative_x",_format_local);
  addCreateTexture(this,&local_b8,0x30b4,type_local,local_20,local_24);
  std::__cxx11::string::~string((string *)&local_b8);
  std::operator+(&local_d8,"cubemap_negative_y",_format_local);
  addCreateTexture(this,&local_d8,0x30b6,type_local,local_20,local_24);
  std::__cxx11::string::~string((string *)&local_d8);
  std::operator+(&local_f8,"cubemap_negative_z",_format_local);
  addCreateTexture(this,&local_f8,0x30b8,type_local,local_20,local_24);
  std::__cxx11::string::~string((string *)&local_f8);
  return;
}

Assistant:

void ImageTests::addCreateTextureCubemapActions (const string& suffix, GLenum internalFormat, GLenum format, GLenum type)
{
	addCreateTexture("cubemap_positive_x" + suffix,	EGL_GL_TEXTURE_CUBE_MAP_POSITIVE_X_KHR, internalFormat,	format,	type);
	addCreateTexture("cubemap_positive_y" + suffix,	EGL_GL_TEXTURE_CUBE_MAP_POSITIVE_Y_KHR, internalFormat,	format,	type);
	addCreateTexture("cubemap_positive_z" + suffix,	EGL_GL_TEXTURE_CUBE_MAP_POSITIVE_Z_KHR, internalFormat,	format,	type);
	addCreateTexture("cubemap_negative_x" + suffix,	EGL_GL_TEXTURE_CUBE_MAP_NEGATIVE_X_KHR, internalFormat,	format,	type);
	addCreateTexture("cubemap_negative_y" + suffix,	EGL_GL_TEXTURE_CUBE_MAP_NEGATIVE_Y_KHR, internalFormat,	format,	type);
	addCreateTexture("cubemap_negative_z" + suffix,	EGL_GL_TEXTURE_CUBE_MAP_NEGATIVE_Z_KHR, internalFormat,	format,	type);
}